

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O1

void * alsa_run_thread(void *context)

{
  float fVar1;
  long *plVar2;
  long *plVar3;
  void *pvVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  snd_pcm_state_t sVar9;
  undefined4 uVar10;
  long lVar11;
  undefined4 *puVar12;
  ulong uVar13;
  snd_pcm_uframes_t sVar14;
  snd_pcm_uframes_t sVar15;
  ssize_t sVar16;
  snd_pcm_uframes_t sVar17;
  float *b;
  uint uVar18;
  long *plVar19;
  long lVar20;
  ulong uVar21;
  undefined8 uVar22;
  pthread_mutex_t *ppVar23;
  size_t sVar24;
  long lVar25;
  char dummy;
  unsigned_short revents;
  undefined8 local_68;
  long local_58;
  undefined1 local_41;
  pthread_mutex_t *local_40;
  unsigned_short local_32;
  
  ppVar23 = (pthread_mutex_t *)((long)context + 0x18);
  local_40 = ppVar23;
  do {
    pthread_mutex_lock(ppVar23);
    if (*(int *)((long)context + 0xd0) != 0) {
      sVar24 = 1;
      lVar11 = 0;
      do {
        lVar25 = *(long *)((long)context + lVar11 * 8 + 0x40);
        if ((lVar25 != 0) && (*(undefined8 *)(lVar25 + 0xc0) = 0, *(int *)(lVar25 + 0xb0) == 1)) {
          sVar24 = sVar24 + *(long *)(lVar25 + 200);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x10);
      free(*(void **)((long)context + 0xc0));
      puVar12 = (undefined4 *)calloc(sVar24,8);
      *(undefined4 **)((long)context + 0xc0) = puVar12;
      *(size_t *)((long)context + 200) = sVar24;
      *puVar12 = *(undefined4 *)((long)context + 0xd8);
      *(undefined2 *)(puVar12 + 1) = 9;
      lVar11 = 1;
      lVar25 = 0;
      do {
        lVar20 = *(long *)((long)context + lVar25 * 8 + 0x40);
        if ((lVar20 != 0) && (*(int *)(lVar20 + 0xb0) == 1)) {
          memcpy((void *)(*(long *)((long)context + 0xc0) + lVar11 * 8),*(void **)(lVar20 + 0xb8),
                 *(long *)(lVar20 + 200) << 3);
          *(long *)(lVar20 + 0xc0) = lVar11 * 8 + *(long *)((long)context + 0xc0);
          lVar11 = lVar11 + *(long *)(lVar20 + 200);
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0x10);
      *(undefined4 *)((long)context + 0xd0) = 0;
    }
    iVar8 = 1000;
    lVar11 = 0;
    do {
      lVar25 = *(long *)((long)context + lVar11 * 8 + 0x40);
      if ((lVar25 != 0) && (*(int *)(lVar25 + 0xb0) == 2)) {
        iVar7 = timeval_to_relative_ms((timeval *)(lVar25 + 0xd0));
        iVar6 = iVar7;
        if (iVar8 < iVar7) {
          iVar6 = iVar8;
        }
        if (-1 < iVar7) {
          iVar8 = iVar6;
        }
      }
      ppVar23 = local_40;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x10);
    pthread_mutex_unlock(local_40);
    iVar8 = poll(*(pollfd **)((long)context + 0xc0),*(nfds_t *)((long)context + 200),iVar8);
    pthread_mutex_lock(ppVar23);
    if (iVar8 < 1) {
      if (iVar8 == 0) {
        lVar11 = 0;
        do {
          plVar2 = *(long **)((long)context + lVar11 * 8 + 0x40);
          if (plVar2 != (long *)0x0) {
            if (((int)plVar2[0x16] == 2) &&
               (iVar8 = timeval_to_relative_ms((timeval *)(plVar2 + 0x1a)), iVar8 < 1)) {
              uVar22 = 2;
              uVar10 = 0;
            }
            else {
              if (((int)plVar2[0x16] != 1) ||
                 (iVar8 = timeval_to_relative_ms((timeval *)(plVar2 + 0x1c)), -0x2711 < iVar8))
              goto LAB_0012c996;
              uVar22 = 3;
              uVar10 = 4;
            }
            lVar25 = *plVar2;
            *(undefined4 *)(plVar2 + 0x16) = uVar10;
            pthread_cond_broadcast((pthread_cond_t *)(plVar2 + 0x10));
            *(undefined4 *)(lVar25 + 0xd0) = 1;
            write(*(int *)(lVar25 + 0xdc),"x",1);
            (*(code *)plVar2[9])(plVar2,plVar2[1],uVar22);
          }
LAB_0012c996:
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x10);
      }
    }
    else {
      if (((*(byte *)(*(long *)((long)context + 0xc0) + 6) & 1) != 0) &&
         (read(*(int *)((long)context + 0xd8),&local_41,1), *(int *)((long)context + 0xd4) != 0)) {
        pthread_mutex_unlock(ppVar23);
        return (void *)0x0;
      }
      lVar11 = 0;
      do {
        plVar2 = *(long **)((long)context + lVar11 * 8 + 0x40);
        if ((((plVar2 != (long *)0x0) && ((int)plVar2[0x16] == 1)) && (plVar2[0x18] != 0)) &&
           (plVar2[0x19] != 0)) {
          lVar25 = 0;
LAB_0012c2bf:
          if (*(short *)(plVar2[0x18] + 6 + lVar25 * 8) == 0) goto code_r0x0012c2c7;
          lVar25 = *plVar2;
          *(undefined4 *)(plVar2 + 0x16) = 3;
          pthread_cond_broadcast((pthread_cond_t *)(plVar2 + 0x10));
          *(undefined4 *)(lVar25 + 0xd0) = 1;
          write(*(int *)(lVar25 + 0xdc),"x",1);
          pthread_mutex_unlock(local_40);
          ppVar23 = (pthread_mutex_t *)(plVar2 + 2);
          pthread_mutex_lock(ppVar23);
          (*cubeb_snd_pcm_poll_descriptors_revents)
                    ((snd_pcm_t *)plVar2[7],(pollfd *)plVar2[0x18],*(uint *)(plVar2 + 0x19),
                     &local_32);
          uVar13 = (*cubeb_snd_pcm_avail_update)((snd_pcm_t *)plVar2[7]);
          if (uVar13 == 0) {
            pthread_mutex_unlock(ppVar23);
            local_68._0_4_ = 1;
          }
          else {
            uVar21 = plVar2[0xc];
            if (uVar21 < (uVar13 & 0xffffffff)) {
              uVar13 = uVar21;
            }
            sVar14 = uVar13;
            if (((int)plVar2[0x21] == 1) && (0 < (long)uVar13)) {
              if (uVar21 < plVar2[0x20] + uVar13) {
                plVar2[0x20] = 0;
              }
              sVar14 = (*cubeb_snd_pcm_readi)
                                 ((snd_pcm_t *)plVar2[7],(void *)(plVar2[0x1f] + plVar2[0x20]),
                                  uVar13);
              if (-1 < (long)sVar14) {
                plVar2[0x20] = plVar2[0x20] + sVar14;
                plVar2[10] = plVar2[10] + sVar14;
                gettimeofday((timeval *)(plVar2 + 0x1c),(__timezone_ptr_t)0x0);
                sVar14 = uVar13;
              }
            }
            sVar17 = sVar14;
            if ((((int)plVar2[0x21] == 1) && (lVar25 = plVar2[0x20], lVar25 != 0)) &&
               ((plVar3 = (long *)plVar2[0x22], plVar19 = plVar2, plVar3 == (long *)0x0 ||
                (plVar19 = plVar3, (ulong)plVar3[0x20] < (ulong)plVar3[0xc])))) {
              if (plVar3 == (long *)0x0) {
                local_58 = 0;
              }
              else {
                local_58 = plVar3[0x1f] + plVar3[0x20];
                if (plVar3[0xc] - plVar3[0x20] <= lVar25) {
                  lVar25 = plVar3[0xc] - plVar3[0x20];
                }
              }
              pthread_mutex_unlock(ppVar23);
              sVar15 = (*(code *)plVar2[8])(plVar19,plVar2[1],plVar2[0x1f],local_58,lVar25);
              pthread_mutex_lock(ppVar23);
              sVar17 = sVar15;
              if (-1 < (long)sVar15) {
                lVar25 = plVar2[0x1f];
                sVar16 = (*cubeb_snd_pcm_frames_to_bytes)((snd_pcm_t *)plVar2[7],sVar15);
                pvVar4 = (void *)plVar2[0x1f];
                sVar24 = (*cubeb_snd_pcm_frames_to_bytes)
                                   ((snd_pcm_t *)plVar2[7],plVar2[0x20] - sVar15);
                memmove(pvVar4,(void *)(lVar25 + sVar16),sVar24);
                plVar2[0x20] = plVar2[0x20] - sVar15;
                sVar17 = sVar14;
                if (plVar2[0x22] != 0) {
                  plVar3 = (long *)(plVar2[0x22] + 0x100);
                  *plVar3 = *plVar3 + sVar15;
                }
              }
            }
            sVar14 = sVar17;
            if ((int)plVar2[0x21] == 0) {
              lVar25 = plVar2[0x20];
              lVar20 = sVar17 - lVar25;
              if ((lVar20 != 0 && lVar25 <= (long)sVar17) &&
                 ((lVar5 = plVar2[0x22], lVar5 == 0 || (*(long *)(lVar5 + 0x100) != 0)))) {
                if (lVar5 == 0) {
                  local_68 = 0;
                }
                else {
                  local_68 = *(undefined8 *)(lVar5 + 0xf8);
                }
                lVar5 = plVar2[0x1f];
                sVar16 = (*cubeb_snd_pcm_frames_to_bytes)((snd_pcm_t *)plVar2[7],lVar25);
                if ((plVar2[0x22] != 0) &&
                   (lVar25 = *(long *)(plVar2[0x22] + 0x100), lVar25 <= lVar20)) {
                  lVar20 = lVar25;
                }
                pthread_mutex_unlock(ppVar23);
                sVar15 = (*(code *)plVar2[8])(plVar2,plVar2[1],local_68,lVar5 + sVar16,lVar20);
                pthread_mutex_lock(ppVar23);
                sVar14 = sVar15;
                if (-1 < (long)sVar15) {
                  plVar2[0x20] = plVar2[0x20] + sVar15;
                  lVar25 = plVar2[0x22];
                  sVar14 = sVar17;
                  if (lVar25 != 0) {
                    lVar20 = *(long *)(lVar25 + 0xf8);
                    sVar16 = (*cubeb_snd_pcm_frames_to_bytes)(*(snd_pcm_t **)(lVar25 + 0x38),sVar15)
                    ;
                    pvVar4 = *(void **)(lVar25 + 0xf8);
                    sVar24 = (*cubeb_snd_pcm_frames_to_bytes)
                                       (*(snd_pcm_t **)(lVar25 + 0x38),
                                        *(long *)(lVar25 + 0x100) - sVar15);
                    memmove(pvVar4,(void *)(lVar20 + sVar16),sVar24);
                    *(long *)(lVar25 + 0x100) = *(long *)(lVar25 + 0x100) - sVar15;
                  }
                }
              }
            }
            local_68._0_4_ = 1;
            if ((int)plVar2[0x21] == 0) {
              lVar25 = plVar2[0x20];
              lVar20 = sVar14 - lVar25;
              if (lVar20 != 0 && lVar25 <= (long)sVar14) {
                uVar18 = *(uint *)((long)plVar2 + 0x6c);
                lVar5 = plVar2[0x1f];
                sVar16 = (*cubeb_snd_pcm_frames_to_bytes)((snd_pcm_t *)plVar2[7],lVar25);
                sVar24 = (*cubeb_snd_pcm_frames_to_bytes)((snd_pcm_t *)plVar2[7],lVar20);
                memset((void *)(lVar5 + sVar16),0,sVar24);
                plVar2[0x20] = sVar14;
                if ((plVar2[0x22] == 0) || (*(long *)(plVar2[0x22] + 0x100) != 0)) {
                  uVar21 = (ulong)(((double)lVar20 / (double)uVar18) * 1000.0);
                  gettimeofday((timeval *)(plVar2 + 0x1a),(__timezone_ptr_t)0x0);
                  uVar13 = uVar21 & 0xffffffff;
                  plVar2[0x1a] = plVar2[0x1a] + uVar13 / 1000;
                  plVar2[0x1b] = plVar2[0x1b] +
                                 (ulong)(uint)(((int)uVar21 + (int)(uVar13 / 1000) * -1000) * 1000);
                  local_68._0_4_ = 2;
                }
              }
            }
            sVar17 = sVar14;
            if (((int)plVar2[0x21] == 0) && (0 < (long)sVar14)) {
              lVar20 = *(uint *)(plVar2 + 0xe) * sVar14;
              lVar25 = plVar2[0x1f];
              if ((int)plVar2[0xd] == 2) {
                if (0 < lVar20) {
                  uVar18 = 1;
                  uVar13 = 0;
                  do {
                    *(float *)(lVar25 + uVar13 * 4) =
                         *(float *)(plVar2 + 0x1e) * *(float *)(lVar25 + uVar13 * 4);
                    uVar13 = (ulong)uVar18;
                    uVar18 = uVar18 + 1;
                  } while (lVar20 - uVar13 != 0 && (long)uVar13 <= lVar20);
                }
              }
              else if (0 < lVar20) {
                fVar1 = *(float *)(plVar2 + 0x1e);
                uVar18 = 1;
                uVar13 = 0;
                do {
                  *(short *)(lVar25 + uVar13 * 2) =
                       (short)(int)((float)(int)*(short *)(lVar25 + uVar13 * 2) * fVar1);
                  uVar13 = (ulong)uVar18;
                  uVar18 = uVar18 + 1;
                } while (lVar20 - uVar13 != 0 && (long)uVar13 <= lVar20);
              }
              sVar17 = (*cubeb_snd_pcm_writei)((snd_pcm_t *)plVar2[7],(void *)plVar2[0x1f],sVar14);
              if (-1 < (long)sVar17) {
                lVar25 = plVar2[0x1f];
                sVar16 = (*cubeb_snd_pcm_frames_to_bytes)((snd_pcm_t *)plVar2[7],sVar17);
                pvVar4 = (void *)plVar2[0x1f];
                sVar24 = (*cubeb_snd_pcm_frames_to_bytes)
                                   ((snd_pcm_t *)plVar2[7],plVar2[0x20] - sVar17);
                memmove(pvVar4,(void *)(lVar25 + sVar16),sVar24);
                plVar2[0x20] = plVar2[0x20] - sVar17;
                plVar2[10] = plVar2[10] + sVar17;
                gettimeofday((timeval *)(plVar2 + 0x1c),(__timezone_ptr_t)0x0);
                sVar17 = sVar14;
              }
            }
            if ((long)sVar17 < 0) {
              iVar8 = (*cubeb_snd_pcm_recover)((snd_pcm_t *)plVar2[7],(int)sVar17,0);
              sVar17 = (snd_pcm_uframes_t)iVar8;
              if (((-1 < iVar8) && ((int)plVar2[0x21] == 1)) &&
                 (sVar9 = (*cubeb_snd_pcm_state)((snd_pcm_t *)plVar2[7]),
                 sVar9 == SND_PCM_STATE_PREPARED)) {
                iVar8 = (*cubeb_snd_pcm_start)((snd_pcm_t *)plVar2[7]);
                sVar17 = (snd_pcm_uframes_t)iVar8;
              }
            }
            pthread_mutex_unlock(ppVar23);
            if ((long)sVar17 < 0) {
              (*(code *)plVar2[9])(plVar2,plVar2[1],3);
              local_68._0_4_ = 4;
            }
          }
          pthread_mutex_lock(local_40);
          lVar25 = *plVar2;
          *(undefined4 *)(plVar2 + 0x16) = (undefined4)local_68;
          pthread_cond_broadcast((pthread_cond_t *)(plVar2 + 0x10));
          *(undefined4 *)(lVar25 + 0xd0) = 1;
          write(*(int *)(lVar25 + 0xdc),"x",1);
        }
LAB_0012c8dd:
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x10);
    }
    ppVar23 = local_40;
    pthread_mutex_unlock(local_40);
  } while( true );
code_r0x0012c2c7:
  lVar25 = lVar25 + 1;
  if (plVar2[0x19] == lVar25) goto LAB_0012c8dd;
  goto LAB_0012c2bf;
}

Assistant:

static void *
alsa_run_thread(void * context)
{
  cubeb * ctx = context;
  int r;

  do {
    r = alsa_run(ctx);
  } while (r >= 0);

  return NULL;
}